

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

void mark_live(C_Parser *parser,C_Obj *var)

{
  C_Obj *var_00;
  int i;
  long lVar1;
  
  if ((var->is_function == true) && (var->is_live == false)) {
    var->is_live = true;
    for (lVar1 = 0; lVar1 < (var->refs).len; lVar1 = lVar1 + 1) {
      var_00 = find_func(parser,(var->refs).data[lVar1]);
      if (var_00 != (C_Obj *)0x0) {
        mark_live(parser,var_00);
      }
    }
  }
  return;
}

Assistant:

static void mark_live(C_Parser *parser, C_Obj *var) {
  if (!var->is_function || var->is_live)
    return;
  var->is_live = true;

  for (int i = 0; i < var->refs.len; i++) {
    C_Obj *fn = find_func(parser, var->refs.data[i]);
    if (fn)
      mark_live(parser, fn);
  }
}